

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimalintegration.cpp
# Opt level: O0

void __thiscall
QMinimalIntegration::QMinimalIntegration(QMinimalIntegration *this,QStringList *parameters)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  QMinimalScreen *this_00;
  QPlatformIntegration *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc8;
  bool bVar6;
  undefined8 local_18;
  QStringList *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QPlatformIntegration::QPlatformIntegration(in_RDI);
  *(undefined ***)in_RDI = &PTR__QMinimalIntegration_0010c840;
  *(undefined8 *)(in_RDI + 8) = 0;
  QScopedPointer<QPlatformNativeInterface,_QScopedPointerDeleter<QPlatformNativeInterface>_>::
  QScopedPointer((QScopedPointer<QPlatformNativeInterface,_QScopedPointerDeleter<QPlatformNativeInterface>_>
                  *)(in_RDI + 0x10),(QPlatformNativeInterface *)0x0);
  uVar3 = parseOptions(in_stack_fffffffffffffff0);
  *(uint *)(in_RDI + 0x20) = uVar3;
  uVar5 = qEnvironmentVariableIsSet("QT_DEBUG_BACKINGSTORE");
  if (((uVar5 & 1) != 0) &&
     (iVar4 = qEnvironmentVariableIntValue("QT_DEBUG_BACKINGSTORE",(bool *)0x0), 0 < iVar4)) {
    *(uint *)(in_RDI + 0x20) = *(uint *)(in_RDI + 0x20) | 3;
  }
  this_00 = (QMinimalScreen *)operator_new(0x30);
  QMinimalScreen::QMinimalScreen(this_00);
  *(QMinimalScreen **)(in_RDI + 0x18) = this_00;
  bVar6 = false;
  QRect::QRect((QRect *)(ulong)in_stack_ffffffffffffffc8,(int)((ulong)this_00 >> 0x20),(int)this_00,
               in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  lVar2 = *(long *)(in_RDI + 0x18);
  *(undefined8 *)(lVar2 + 0x10) = local_18;
  *(QStringList **)(lVar2 + 0x18) = in_stack_fffffffffffffff0;
  *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0x20) = 0x20;
  *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0x24) = 6;
  QWindowSystemInterface::handleScreenAdded(*(QPlatformScreen **)(in_RDI + 0x18),bVar6);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QMinimalIntegration::QMinimalIntegration(const QStringList &parameters)
    : m_fontDatabase(nullptr)
    , m_options(parseOptions(parameters))
{
    if (qEnvironmentVariableIsSet(debugBackingStoreEnvironmentVariable)
        && qEnvironmentVariableIntValue(debugBackingStoreEnvironmentVariable) > 0) {
        m_options |= DebugBackingStore | EnableFonts;
    }

    m_primaryScreen = new QMinimalScreen();

    m_primaryScreen->mGeometry = QRect(0, 0, 240, 320);
    m_primaryScreen->mDepth = 32;
    m_primaryScreen->mFormat = QImage::Format_ARGB32_Premultiplied;

    QWindowSystemInterface::handleScreenAdded(m_primaryScreen);
}